

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

bool slang::syntax::ExpressionSyntax::isKind(SyntaxKind kind)

{
  SyntaxKind kind_local;
  bool local_1;
  
  switch(kind) {
  case AddAssignmentExpression:
  case AddExpression:
  case AndAssignmentExpression:
  case ArithmeticLeftShiftAssignmentExpression:
  case ArithmeticRightShiftAssignmentExpression:
  case ArithmeticShiftLeftExpression:
  case ArithmeticShiftRightExpression:
  case ArrayAndMethod:
  case ArrayOrMethod:
  case ArrayOrRandomizeMethodExpression:
  case ArrayUniqueMethod:
  case ArrayXorMethod:
  case AssignmentExpression:
  case AssignmentPatternExpression:
  case BadExpression:
  case BinaryAndExpression:
  case BinaryOrExpression:
  case BinaryXnorExpression:
  case BinaryXorExpression:
  case BitType:
  case ByteType:
  case CHandleType:
  case CaseEqualityExpression:
  case CaseInequalityExpression:
  case CastExpression:
  case ClassName:
  case ConcatenationExpression:
  case ConditionalExpression:
  case ConstructorName:
  case CopyClassExpression:
  case DefaultPatternKeyExpression:
  case DivideAssignmentExpression:
  case DivideExpression:
  case ElementSelectExpression:
  case EmptyIdentifierName:
  case EmptyQueueExpression:
  case EnumType:
  case EqualityExpression:
  case EventType:
  case ExpressionOrDist:
  case GreaterThanEqualExpression:
  case GreaterThanExpression:
  case IdentifierName:
  case IdentifierSelectName:
  case ImplicitType:
  case InequalityExpression:
  case InsideExpression:
  case IntType:
  case IntegerLiteralExpression:
  case IntegerType:
  case IntegerVectorExpression:
  case InvocationExpression:
  case LessThanEqualExpression:
  case LessThanExpression:
  case LocalScope:
  case LogicType:
  case LogicalAndExpression:
  case LogicalEquivalenceExpression:
  case LogicalImplicationExpression:
  case LogicalLeftShiftAssignmentExpression:
  case LogicalOrExpression:
  case LogicalRightShiftAssignmentExpression:
  case LogicalShiftLeftExpression:
  case LogicalShiftRightExpression:
  case LongIntType:
  case MemberAccessExpression:
  case MinTypMaxExpression:
  case ModAssignmentExpression:
  case ModExpression:
  case MultipleConcatenationExpression:
  case MultiplyAssignmentExpression:
  case MultiplyExpression:
  case NamedType:
  case NewArrayExpression:
  case NewClassExpression:
  case NonblockingAssignmentExpression:
  case NullLiteralExpression:
  case OrAssignmentExpression:
  case ParenthesizedExpression:
  case PostdecrementExpression:
  case PostincrementExpression:
  case PowerExpression:
  case PropertyType:
  case RealLiteralExpression:
  case RealTimeType:
  case RealType:
  case RegType:
  case RootScope:
  case ScopedName:
  case SequenceType:
  case ShortIntType:
  case ShortRealType:
  case SignedCastExpression:
  case StreamingConcatenationExpression:
  case StringLiteralExpression:
  case StringType:
  case StructType:
  case SubtractAssignmentExpression:
  case SubtractExpression:
  case SuperHandle:
  case SuperNewDefaultedArgsExpression:
  case SystemName:
  case TaggedUnionExpression:
  case ThisHandle:
  case TimeLiteralExpression:
  case TimeType:
  case TimingControlExpression:
  case TypeReference:
  case UnaryBitwiseAndExpression:
  case UnaryBitwiseNandExpression:
  case UnaryBitwiseNorExpression:
  case UnaryBitwiseNotExpression:
  case UnaryBitwiseOrExpression:
  case UnaryBitwiseXnorExpression:
  case UnaryBitwiseXorExpression:
  case UnaryLogicalNotExpression:
  case UnaryMinusExpression:
  case UnaryPlusExpression:
  case UnaryPredecrementExpression:
  case UnaryPreincrementExpression:
  case UnbasedUnsizedLiteralExpression:
  case UnionType:
  case UnitScope:
  case Untyped:
  case ValueRangeExpression:
  case VirtualInterfaceType:
  case VoidType:
  case WildcardEqualityExpression:
  case WildcardInequalityExpression:
  case WildcardLiteralExpression:
  case XorAssignmentExpression:
    local_1 = true;
    break;
  default:
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool ExpressionSyntax::isKind(SyntaxKind kind) {
    switch (kind) {
        case SyntaxKind::AddAssignmentExpression:
        case SyntaxKind::AddExpression:
        case SyntaxKind::AndAssignmentExpression:
        case SyntaxKind::ArithmeticLeftShiftAssignmentExpression:
        case SyntaxKind::ArithmeticRightShiftAssignmentExpression:
        case SyntaxKind::ArithmeticShiftLeftExpression:
        case SyntaxKind::ArithmeticShiftRightExpression:
        case SyntaxKind::ArrayAndMethod:
        case SyntaxKind::ArrayOrMethod:
        case SyntaxKind::ArrayOrRandomizeMethodExpression:
        case SyntaxKind::ArrayUniqueMethod:
        case SyntaxKind::ArrayXorMethod:
        case SyntaxKind::AssignmentExpression:
        case SyntaxKind::AssignmentPatternExpression:
        case SyntaxKind::BadExpression:
        case SyntaxKind::BinaryAndExpression:
        case SyntaxKind::BinaryOrExpression:
        case SyntaxKind::BinaryXnorExpression:
        case SyntaxKind::BinaryXorExpression:
        case SyntaxKind::BitType:
        case SyntaxKind::ByteType:
        case SyntaxKind::CHandleType:
        case SyntaxKind::CaseEqualityExpression:
        case SyntaxKind::CaseInequalityExpression:
        case SyntaxKind::CastExpression:
        case SyntaxKind::ClassName:
        case SyntaxKind::ConcatenationExpression:
        case SyntaxKind::ConditionalExpression:
        case SyntaxKind::ConstructorName:
        case SyntaxKind::CopyClassExpression:
        case SyntaxKind::DefaultPatternKeyExpression:
        case SyntaxKind::DivideAssignmentExpression:
        case SyntaxKind::DivideExpression:
        case SyntaxKind::ElementSelectExpression:
        case SyntaxKind::EmptyIdentifierName:
        case SyntaxKind::EmptyQueueExpression:
        case SyntaxKind::EnumType:
        case SyntaxKind::EqualityExpression:
        case SyntaxKind::EventType:
        case SyntaxKind::ExpressionOrDist:
        case SyntaxKind::GreaterThanEqualExpression:
        case SyntaxKind::GreaterThanExpression:
        case SyntaxKind::IdentifierName:
        case SyntaxKind::IdentifierSelectName:
        case SyntaxKind::ImplicitType:
        case SyntaxKind::InequalityExpression:
        case SyntaxKind::InsideExpression:
        case SyntaxKind::IntType:
        case SyntaxKind::IntegerLiteralExpression:
        case SyntaxKind::IntegerType:
        case SyntaxKind::IntegerVectorExpression:
        case SyntaxKind::InvocationExpression:
        case SyntaxKind::LessThanEqualExpression:
        case SyntaxKind::LessThanExpression:
        case SyntaxKind::LocalScope:
        case SyntaxKind::LogicType:
        case SyntaxKind::LogicalAndExpression:
        case SyntaxKind::LogicalEquivalenceExpression:
        case SyntaxKind::LogicalImplicationExpression:
        case SyntaxKind::LogicalLeftShiftAssignmentExpression:
        case SyntaxKind::LogicalOrExpression:
        case SyntaxKind::LogicalRightShiftAssignmentExpression:
        case SyntaxKind::LogicalShiftLeftExpression:
        case SyntaxKind::LogicalShiftRightExpression:
        case SyntaxKind::LongIntType:
        case SyntaxKind::MemberAccessExpression:
        case SyntaxKind::MinTypMaxExpression:
        case SyntaxKind::ModAssignmentExpression:
        case SyntaxKind::ModExpression:
        case SyntaxKind::MultipleConcatenationExpression:
        case SyntaxKind::MultiplyAssignmentExpression:
        case SyntaxKind::MultiplyExpression:
        case SyntaxKind::NamedType:
        case SyntaxKind::NewArrayExpression:
        case SyntaxKind::NewClassExpression:
        case SyntaxKind::NonblockingAssignmentExpression:
        case SyntaxKind::NullLiteralExpression:
        case SyntaxKind::OrAssignmentExpression:
        case SyntaxKind::ParenthesizedExpression:
        case SyntaxKind::PostdecrementExpression:
        case SyntaxKind::PostincrementExpression:
        case SyntaxKind::PowerExpression:
        case SyntaxKind::PropertyType:
        case SyntaxKind::RealLiteralExpression:
        case SyntaxKind::RealTimeType:
        case SyntaxKind::RealType:
        case SyntaxKind::RegType:
        case SyntaxKind::RootScope:
        case SyntaxKind::ScopedName:
        case SyntaxKind::SequenceType:
        case SyntaxKind::ShortIntType:
        case SyntaxKind::ShortRealType:
        case SyntaxKind::SignedCastExpression:
        case SyntaxKind::StreamingConcatenationExpression:
        case SyntaxKind::StringLiteralExpression:
        case SyntaxKind::StringType:
        case SyntaxKind::StructType:
        case SyntaxKind::SubtractAssignmentExpression:
        case SyntaxKind::SubtractExpression:
        case SyntaxKind::SuperHandle:
        case SyntaxKind::SuperNewDefaultedArgsExpression:
        case SyntaxKind::SystemName:
        case SyntaxKind::TaggedUnionExpression:
        case SyntaxKind::ThisHandle:
        case SyntaxKind::TimeLiteralExpression:
        case SyntaxKind::TimeType:
        case SyntaxKind::TimingControlExpression:
        case SyntaxKind::TypeReference:
        case SyntaxKind::UnaryBitwiseAndExpression:
        case SyntaxKind::UnaryBitwiseNandExpression:
        case SyntaxKind::UnaryBitwiseNorExpression:
        case SyntaxKind::UnaryBitwiseNotExpression:
        case SyntaxKind::UnaryBitwiseOrExpression:
        case SyntaxKind::UnaryBitwiseXnorExpression:
        case SyntaxKind::UnaryBitwiseXorExpression:
        case SyntaxKind::UnaryLogicalNotExpression:
        case SyntaxKind::UnaryMinusExpression:
        case SyntaxKind::UnaryPlusExpression:
        case SyntaxKind::UnaryPredecrementExpression:
        case SyntaxKind::UnaryPreincrementExpression:
        case SyntaxKind::UnbasedUnsizedLiteralExpression:
        case SyntaxKind::UnionType:
        case SyntaxKind::UnitScope:
        case SyntaxKind::Untyped:
        case SyntaxKind::ValueRangeExpression:
        case SyntaxKind::VirtualInterfaceType:
        case SyntaxKind::VoidType:
        case SyntaxKind::WildcardEqualityExpression:
        case SyntaxKind::WildcardInequalityExpression:
        case SyntaxKind::WildcardLiteralExpression:
        case SyntaxKind::XorAssignmentExpression:
            return true;
        default:
            return false;
    }
}